

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall
despot::TagSHRPolicy::TagSHRPolicy(TagSHRPolicy *this,DSPOMDP *model,ParticleLowerBound *bound)

{
  Floor *this_00;
  int **ppiVar1;
  int iVar2;
  BaseTag *pBVar3;
  
  despot::DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  *(undefined ***)this = &PTR__TagSHRPolicy_0011f878;
  pBVar3 = (BaseTag *)(model + -0x38);
  if (model == (DSPOMDP *)0x0) {
    pBVar3 = (BaseTag *)0x0;
  }
  this->tag_model_ = pBVar3;
  this_00 = &this->floor_;
  despot::Floor::Floor(this_00);
  pBVar3 = this->tag_model_;
  iVar2 = (pBVar3->floor_).num_cols_;
  ppiVar1 = (pBVar3->floor_).floor_;
  this_00->num_rows_ = (pBVar3->floor_).num_rows_;
  this_00->num_cols_ = iVar2;
  (this->floor_).floor_ = ppiVar1;
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator=
            (&(this->floor_).cells_,&(pBVar3->floor_).cells_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->floor_).dist_,&(pBVar3->floor_).dist_);
  return;
}

Assistant:

TagSHRPolicy(const DSPOMDP* model, ParticleLowerBound* bound) :
		DefaultPolicy(model, bound),
		tag_model_(static_cast<const BaseTag*>(model)) {
		floor_ = tag_model_->floor();
	}